

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_fix_scramble(player *p)

{
  int local_4c;
  int iStack_48;
  wchar_t i;
  int new_max [5];
  int aiStack_28 [2];
  int new_cur [5];
  player *p_local;
  
  local_4c = 0;
  unique0x1000026a = p;
  while( true ) {
    if (4 < local_4c) {
      for (local_4c = 0; local_4c < 5; local_4c = local_4c + 1) {
        stack0xfffffffffffffff0->stat_cur[local_4c] = (int16_t)aiStack_28[local_4c];
        stack0xfffffffffffffff0->stat_max[local_4c] = (int16_t)(&iStack_48)[local_4c];
        stack0xfffffffffffffff0->stat_map[local_4c] = (int16_t)local_4c;
      }
      stack0xfffffffffffffff0->upkeep->update = stack0xfffffffffffffff0->upkeep->update | 1;
      return;
    }
    if ((stack0xfffffffffffffff0->stat_map[local_4c] < 0) ||
       (4 < stack0xfffffffffffffff0->stat_map[local_4c])) break;
    aiStack_28[stack0xfffffffffffffff0->stat_map[local_4c]] =
         (int)stack0xfffffffffffffff0->stat_cur[local_4c];
    (&iStack_48)[stack0xfffffffffffffff0->stat_map[local_4c]] =
         (int)stack0xfffffffffffffff0->stat_max[local_4c];
    local_4c = local_4c + 1;
  }
  __assert_fail("p->stat_map[i] >= 0 && p->stat_map[i] < STAT_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-util.c"
                ,0x1a0,"void player_fix_scramble(struct player *)");
}

Assistant:

void player_fix_scramble(struct player *p)
{
	/* Figure out what stats should be */
	int new_cur[STAT_MAX];
	int new_max[STAT_MAX];
	int i;

	for (i = 0; i < STAT_MAX; ++i) {
		assert(p->stat_map[i] >= 0 && p->stat_map[i] < STAT_MAX);
		new_cur[p->stat_map[i]] = p->stat_cur[i];
		new_max[p->stat_map[i]] = p->stat_max[i];
	}

	/* Apply new stats and reset stat_map */
	for (i = 0; i < STAT_MAX; ++i) {
		p->stat_cur[i] = new_cur[i];
		p->stat_max[i] = new_max[i];
		p->stat_map[i] = i;
	}

	/* Mark what else needs to be updated */
	p->upkeep->update |= (PU_BONUS);
}